

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O1

void __thiscall net_uv::Socket::~Socket(Socket *this)

{
  _Manager_type p_Var1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  this->_vptr_Socket = (_func_int **)&PTR__Socket_00168bf8;
  p_Var1 = (this->m_recvCall).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->m_recvCall,(_Any_data *)&this->m_recvCall,__destroy_functor);
  }
  p_Var1 = (this->m_closeCall).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->m_closeCall,(_Any_data *)&this->m_closeCall,__destroy_functor);
  }
  p_Var1 = (this->m_connectCall).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->m_connectCall,(_Any_data *)&this->m_connectCall,__destroy_functor)
    ;
  }
  pcVar2 = (this->m_ip)._M_dataplus._M_p;
  paVar3 = &(this->m_ip).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

Socket::~Socket()
{
}